

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O3

cupdlp_retcode
PDHG_PostSolve(CUPDLPwork *pdhg,cupdlp_int nCols_origin,cupdlp_int *constraint_new_idx,
              cupdlp_int *constraint_type,cupdlp_float *col_value,cupdlp_float *col_dual,
              cupdlp_float *row_value,cupdlp_float *row_dual,cupdlp_int *value_valid,
              cupdlp_int *dual_valid)

{
  size_t sVar1;
  cupdlp_float weight;
  CUPDLPproblem *pCVar2;
  CUPDLPresobj *pCVar3;
  CUPDLPiterates *pCVar4;
  CUPDLPscaling *pCVar5;
  CUPDLPvec *pCVar6;
  CUPDLPvec *pCVar7;
  CUPDLPvec *pCVar8;
  CUPDLPvec *pCVar9;
  cupdlp_float *pcVar10;
  int iVar11;
  void *__dest;
  void *__dest_00;
  void *__dest_01;
  long lVar12;
  ulong uVar13;
  cupdlp_retcode cVar14;
  int iVar15;
  
  pCVar2 = pdhg->problem;
  pCVar3 = pdhg->resobj;
  pCVar4 = pdhg->iterates;
  pCVar5 = pdhg->scaling;
  weight = pCVar2->sense_origin;
  iVar15 = pCVar2->nCols;
  sVar1 = (long)iVar15 * 8;
  __dest = malloc(sVar1);
  cVar14 = 1;
  if ((__dest == (void *)0x0) ||
     (__dest_00 = malloc((long)pCVar2->nRows << 3), __dest_00 == (void *)0x0)) {
    __dest_00 = (void *)0x0;
    __dest_01 = (void *)0x0;
  }
  else {
    __dest_01 = malloc(sVar1);
    if (__dest_01 == (void *)0x0) {
      __dest_01 = (void *)0x0;
    }
    else {
      iVar11 = pdhg->timers->nIter % 2;
      pCVar6 = pCVar4->x[iVar11];
      pCVar7 = pCVar4->y[iVar11];
      pCVar8 = pCVar4->ax[iVar11];
      if (pCVar5->ifScaled != 0) {
        pCVar9 = pCVar4->aty[iVar11];
        cupdlp_ediv(pCVar6->data,pdhg->colScale,iVar15);
        cupdlp_ediv(pCVar7->data,pdhg->rowScale,pCVar2->nRows);
        cupdlp_edot(pCVar3->dSlackPos,pdhg->colScale,pCVar2->nCols);
        cupdlp_edot(pCVar3->dSlackNeg,pdhg->colScale,pCVar2->nCols);
        cupdlp_edot(pCVar8->data,pdhg->rowScale,pCVar2->nRows);
        cupdlp_edot(pCVar9->data,pdhg->colScale,pCVar2->nCols);
      }
      if (col_value != (cupdlp_float *)0x0) {
        memcpy(col_value,pCVar6->data,(long)nCols_origin * 8);
      }
      if (row_value != (cupdlp_float *)0x0) {
        iVar15 = pCVar2->nRows;
        sVar1 = (long)iVar15 * 8;
        pcVar10 = pCVar8->data;
        if (constraint_new_idx == (cupdlp_int *)0x0) {
          memcpy(row_value,pcVar10,sVar1);
        }
        else {
          memcpy(__dest_00,pcVar10,sVar1);
          if (0 < iVar15) {
            lVar12 = 0;
            do {
              row_value[lVar12] =
                   *(cupdlp_float *)((long)__dest_00 + (long)constraint_new_idx[lVar12] * 8);
              lVar12 = lVar12 + 1;
            } while (iVar15 != lVar12);
          }
        }
        if (constraint_type != (cupdlp_int *)0x0) {
          memcpy(__dest,pCVar6->data,(long)pCVar2->nCols << 3);
          iVar15 = pCVar2->nRows;
          if (0 < (long)iVar15) {
            lVar12 = 0;
            iVar11 = 0;
            do {
              if (constraint_type[lVar12] == 3) {
                row_value[lVar12] =
                     row_value[lVar12] +
                     *(double *)((long)__dest + (long)(nCols_origin + iVar11) * 8);
                iVar11 = iVar11 + 1;
              }
              else if (constraint_type[lVar12] == 1) {
                row_value[lVar12] = -row_value[lVar12];
              }
              lVar12 = lVar12 + 1;
            } while (iVar15 != lVar12);
          }
        }
      }
      if (col_dual != (cupdlp_float *)0x0) {
        sVar1 = (long)nCols_origin * 8;
        memcpy(__dest,pCVar3->dSlackPos,sVar1);
        memcpy(__dest_01,pCVar3->dSlackNeg,sVar1);
        if (0 < nCols_origin) {
          uVar13 = 0;
          do {
            col_dual[uVar13] =
                 *(double *)((long)__dest + uVar13 * 8) - *(double *)((long)__dest_01 + uVar13 * 8);
            uVar13 = uVar13 + 1;
          } while ((uint)nCols_origin != uVar13);
        }
        ScaleVector(weight,col_dual,nCols_origin);
      }
      if (row_dual != (cupdlp_float *)0x0) {
        iVar15 = pCVar2->nRows;
        sVar1 = (long)iVar15 * 8;
        pcVar10 = pCVar7->data;
        if (constraint_new_idx == (cupdlp_int *)0x0) {
          memcpy(row_dual,pcVar10,sVar1);
          iVar15 = pCVar2->nRows;
        }
        else {
          memcpy(__dest_00,pcVar10,sVar1);
          if (0 < iVar15) {
            lVar12 = 0;
            do {
              row_dual[lVar12] =
                   *(cupdlp_float *)((long)__dest_00 + (long)constraint_new_idx[lVar12] * 8);
              lVar12 = lVar12 + 1;
            } while (iVar15 != lVar12);
          }
        }
        ScaleVector(weight,row_dual,iVar15);
        if ((constraint_type != (cupdlp_int *)0x0) && (iVar15 = pCVar2->nRows, 0 < (long)iVar15)) {
          lVar12 = 0;
          do {
            if (constraint_type[lVar12] == 1) {
              row_dual[lVar12] = -row_dual[lVar12];
            }
            lVar12 = lVar12 + 1;
          } while (iVar15 != lVar12);
        }
      }
      if (value_valid != (cupdlp_int *)0x0) {
        *value_valid = (uint)(col_value != (cupdlp_float *)0x0 && row_value != (cupdlp_float *)0x0);
      }
      cVar14 = 0;
      if (dual_valid != (cupdlp_int *)0x0) {
        *dual_valid = (uint)(col_dual != (cupdlp_float *)0x0 && row_dual != (cupdlp_float *)0x0);
      }
    }
  }
  free(__dest);
  free(__dest_00);
  free(__dest_01);
  return cVar14;
}

Assistant:

cupdlp_retcode PDHG_PostSolve(CUPDLPwork *pdhg, cupdlp_int nCols_origin,
                              cupdlp_int *constraint_new_idx,
                              cupdlp_int *constraint_type,
                              cupdlp_float *col_value, cupdlp_float *col_dual,
                              cupdlp_float *row_value, cupdlp_float *row_dual,
                              cupdlp_int *value_valid, cupdlp_int *dual_valid) {
  cupdlp_retcode retcode = RETCODE_OK;

  CUPDLPproblem *problem = pdhg->problem;
  CUPDLPiterates *iterates = pdhg->iterates;
  CUPDLPscaling *scaling = pdhg->scaling;
  CUPDLPresobj *resobj = pdhg->resobj;
  cupdlp_float sense = problem->sense_origin;

  // flag
  cupdlp_int col_value_flag = 0;
  cupdlp_int col_dual_flag = 0;
  cupdlp_int row_value_flag = 0;
  cupdlp_int row_dual_flag = 0;

  // allocate buffer
  cupdlp_float *col_buffer = NULL;
  cupdlp_float *row_buffer = NULL;
  cupdlp_float *col_buffer2 = NULL;
  // no need for row_buffer2
  // cupdlp_float *row_buffer2 = NULL;
  CUPDLP_INIT_DOUBLE(col_buffer, problem->nCols);
  CUPDLP_INIT_DOUBLE(row_buffer, problem->nRows);
  CUPDLP_INIT_DOUBLE(col_buffer2, problem->nCols);
  // CUPDLP_INIT_DOUBLE(row_buffer2, problem->nRows);

  
  cupdlp_int iter = pdhg->timers->nIter;
  CUPDLPvec *x = iterates->x[iter % 2];
  CUPDLPvec *y = iterates->y[iter % 2];
  CUPDLPvec *ax = iterates->ax[iter % 2];
  CUPDLPvec *aty = iterates->aty[iter % 2];

  // unscale
  if (scaling->ifScaled) {
    cupdlp_ediv(x->data, pdhg->colScale, problem->nCols);
    cupdlp_ediv(y->data, pdhg->rowScale, problem->nRows);
    cupdlp_edot(resobj->dSlackPos, pdhg->colScale, problem->nCols);
    cupdlp_edot(resobj->dSlackNeg, pdhg->colScale, problem->nCols);
    cupdlp_edot(ax->data, pdhg->rowScale, problem->nRows);
    cupdlp_edot(aty->data, pdhg->colScale, problem->nCols);
  }

  // col value: extract x from (x, z)
  if (col_value) {
    CUPDLP_COPY_VEC(col_value, x->data, cupdlp_float, nCols_origin);

    col_value_flag = 1;
  }

  // row value
  if (row_value) {
    if (constraint_new_idx) {
      CUPDLP_COPY_VEC(row_buffer, ax->data, cupdlp_float,
                      problem->nRows);

      // un-permute row value
      for (int i = 0; i < problem->nRows; i++) {
        row_value[i] = row_buffer[constraint_new_idx[i]];
      }
    } else {
      CUPDLP_COPY_VEC(row_value, ax->data, cupdlp_float,
                      problem->nRows);
    }

    if (constraint_type) {
      CUPDLP_COPY_VEC(col_buffer, x->data, cupdlp_float,
                      problem->nCols);

      // EQ = 0, LEQ = 1, GEQ = 2, BOUND = 3
      for (int i = 0, j = 0; i < problem->nRows; i++) {
        if (constraint_type[i] == 1) {  // LEQ: multiply -1
          row_value[i] = -row_value[i];
        } else if (constraint_type[i] == 3) {  // BOUND: get Ax from Ax - z
          row_value[i] = row_value[i] + col_buffer[nCols_origin + j];
          j++;
        }
      }
    }

    row_value_flag = 1;
  }

  // col duals of l <= x <= u
  if (col_dual) {
    CUPDLP_COPY_VEC(col_buffer, resobj->dSlackPos, cupdlp_float, nCols_origin);
    CUPDLP_COPY_VEC(col_buffer2, resobj->dSlackNeg, cupdlp_float, nCols_origin);

    for (int i = 0; i < nCols_origin; i++) {
      col_dual[i] = col_buffer[i] - col_buffer2[i];
    }

    ScaleVector(sense, col_dual, nCols_origin);

    col_dual_flag = 1;
  }

  // row dual: recover y
  if (row_dual) {
    if (constraint_new_idx) {
      CUPDLP_COPY_VEC(row_buffer, y->data, cupdlp_float,
                      problem->nRows);
      // un-permute row dual
      for (int i = 0; i < problem->nRows; i++) {
        row_dual[i] = row_buffer[constraint_new_idx[i]];
      }
    } else {
      CUPDLP_COPY_VEC(row_dual, y->data, cupdlp_float,
                      problem->nRows);
    }

    ScaleVector(sense, row_dual, problem->nRows);

    if (constraint_type) {
      // EQ = 0, LEQ = 1, GEQ = 2, BOUND = 3
      for (int i = 0; i < problem->nRows; i++) {
        if (constraint_type[i] == 1) {  // LEQ: multiply -1
          row_dual[i] = -row_dual[i];
        }
      }
    }

    row_dual_flag = 1;
  }

  // valid
  if (value_valid) {
    *value_valid = col_value_flag && row_value_flag;
  }

  if (dual_valid) {
    *dual_valid = col_dual_flag && row_dual_flag;
  }

exit_cleanup:
  // free buffer
  CUPDLP_FREE(col_buffer);
  CUPDLP_FREE(row_buffer);
  CUPDLP_FREE(col_buffer2);
  // CUPDLP_FREE(row_buffer2);

  return retcode;
}